

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O0

int test_nils(void)

{
  int iVar1;
  uint32_t uVar2;
  ptrdiff_t local_38;
  ptrdiff_t sz;
  char *local_28;
  char *d4;
  char *d3;
  char *d2;
  char *d1;
  
  _plan(0xf,true);
  _space((FILE *)_stdout);
  printf("# *** %s ***\n","test_nils");
  d2 = mp_encode_nil(data);
  d3 = data;
  d4 = data;
  local_28 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"nil");
  sz._4_4_ = fprintf(_stdout,"\n");
  mp_decode_nil(&d3);
  mp_next(&d4);
  iVar1 = mp_check(&local_28,d4 + 1);
  _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 1)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x164,
      "mp_check_nil()");
  _ok((uint)((long)d2 - (long)data == 1),"(d1 - data) == 1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x165,
      "len(mp_encode_nil() == 1");
  _ok((uint)(d2 == d3),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x166,
      "len(mp_decode_nil()) == 1");
  _ok((uint)(d2 == d4),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x167,
      "len(mp_next_nil()) == 1");
  _ok((uint)(d2 == local_28),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x168,
      "len(mp_check_nil()) == 1");
  uVar2 = mp_sizeof_nil();
  _ok((uint)(uVar2 == 1),"mp_sizeof_nil() == 1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x169,
      "mp_sizeof_nil() == 1");
  local_38 = 0;
  d2 = mp_encode_nil_safe((char *)0x0,&local_38);
  _ok((uint)(local_38 == -1),"-sz == 1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x16d,
      "size after mp_encode_nil_safe(NULL, &sz)");
  _ok((uint)(d2 == (char *)0x0),"d1 == NULL",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x16e,
      "mp_encode_nil_safe(NULL, &sz)");
  local_38 = 1;
  d2 = mp_encode_nil_safe(data,&local_38);
  _ok((uint)(local_38 == 0),"sz == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x172,
      "size after mp_encode_nil_safe(buf, &sz)");
  _ok((uint)((long)d2 - (long)data == 1),"d1 - data == 1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x173,
      "len of mp_encode_nil_safe(buf, &sz)");
  _ok((uint)(*data == -0x40),"(unsigned char)data[0] == 0xc0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x174,
      "mp_encode_nil_safe(buf, &sz)");
  local_38 = 0;
  d2 = mp_encode_nil_safe(data,&local_38);
  _ok((uint)(local_38 == -1),"sz == -1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x178,
      "size after mp_encode_nil_safe(buf, &sz) overflow");
  _ok((uint)(d2 == data),"d1 == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x179,
      "mp_encode_nil_safe(buf, &sz) overflow");
  d2 = mp_encode_nil_safe(data,(ptrdiff_t *)0x0);
  _ok((uint)((long)d2 - (long)data == 1),"d1 - data == 1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x17c,
      "len of mp_encode_nil_safe(buf, NULL)");
  _ok((uint)(*data == -0x40),"(unsigned char)data[0] == 0xc0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x17d,
      "mp_encode_nil_safe(buf, NULL)");
  _space((FILE *)_stdout);
  printf("# *** %s: done ***\n","test_nils");
  iVar1 = check_plan();
  return iVar1;
}

Assistant:

static int
test_nils(void)
{
	plan(15);
	header();

	const char *d1 = mp_encode_nil(data);
	const char *d2 = data;
	const char *d3 = data;
	const char *d4 = data;
	note("nil");
	mp_decode_nil(&d2);
	mp_next(&d3);
	ok(!mp_check(&d4, d3 + 1), "mp_check_nil()");
	is((d1 - data), 1, "len(mp_encode_nil() == 1");
	is(d1, d2, "len(mp_decode_nil()) == 1");
	is(d1, d3, "len(mp_next_nil()) == 1");
	is(d1, d4, "len(mp_check_nil()) == 1");
	is(mp_sizeof_nil(), 1, "mp_sizeof_nil() == 1");

	ptrdiff_t sz = 0;
	d1 = mp_encode_nil_safe(NULL, &sz);
	is(-sz, 1, "size after mp_encode_nil_safe(NULL, &sz)");
	is(d1, NULL, "mp_encode_nil_safe(NULL, &sz)");

	sz = 1;
	d1 = mp_encode_nil_safe(data, &sz);
	is(sz, 0, "size after mp_encode_nil_safe(buf, &sz)");
	is(d1 - data, 1, "len of mp_encode_nil_safe(buf, &sz)");
	is((unsigned char)data[0], 0xc0, "mp_encode_nil_safe(buf, &sz)");

	sz = 0;
	d1 = mp_encode_nil_safe(data, &sz);
	is(sz, -1, "size after mp_encode_nil_safe(buf, &sz) overflow");
	is(d1, data, "mp_encode_nil_safe(buf, &sz) overflow");

	d1 = mp_encode_nil_safe(data, NULL);
	is(d1 - data, 1, "len of mp_encode_nil_safe(buf, NULL)");
	is((unsigned char)data[0], 0xc0, "mp_encode_nil_safe(buf, NULL)");

	footer();
	return check_plan();
}